

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedBlending::releaseFramebuffer(DrawBuffersIndexedBlending *this)

{
  int iVar1;
  undefined4 extraout_var;
  ResourceError *this_00;
  BlendMaskStateMachine state;
  GLenum bufs [1];
  GLint maxDrawBuffers;
  undefined1 local_50 [16];
  BlendMaskState local_40;
  long lVar2;
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_40.mask_r = '\0';
  local_40.mask_g = '\0';
  local_40.mask_b = '\0';
  local_40.mask_a = '\0';
  (**(code **)(lVar2 + 0x868))(0x8824,&local_40.mask_r);
  if (3 < (int)local_40._28_4_) {
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_50,
               (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
               ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log,local_40._28_4_);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetDefaults((BlendMaskStateMachine *)local_50);
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    (**(code **)(lVar2 + 0x78))(0x8d40,0);
    local_40.func_dst_a = 0x405;
    (**(code **)(lVar2 + 0x560))(1);
    (**(code **)(lVar2 + 0x1218))(0x405);
    if ((pointer)local_50._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_50._0_8_,local_40._0_8_ - local_50._0_8_);
    }
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Minimum number of draw buffers too low","");
  tcu::ResourceError::ResourceError(this_00,(string *)local_50);
  __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawBuffersIndexedBlending::releaseFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	state.SetDefaults();
	gl.deleteFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	glw::GLenum bufs[1] = { GL_BACK };
	gl.drawBuffers(1, bufs);
	gl.readBuffer(GL_BACK);
}